

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1195::run(TestCase1195 *this)

{
  long lVar1;
  uint i;
  ulong uVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  uint local_1a0;
  ListElementCount local_19c;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> builder;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  reader.reader._0_16_ = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  Orphanage::newOrphan<capnp::List<unsigned_int,(capnp::Kind)0>>(&orphan,(Orphanage *)&reader,7);
  OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
            (&builder,&orphan.builder);
  uVar2 = 0;
  for (lVar1 = -7; lVar1 != 0; lVar1 = lVar1 + 1) {
    *(int *)(builder.builder.ptr + (uVar2 >> 3)) = (int)lVar1 + 0x75bcd1c;
    uVar2 = uVar2 + builder.builder.step;
  }
  AVar3 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
  if (((AVar3.ptr)->size_ != 5) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0 = 5;
    AVar3 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
    reader.reader.segment = (SegmentReader *)(AVar3.ptr)->size_;
    kj::_::Debug::log<char_const(&)[67],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4b3,ERROR,
               "\"failed: expected \" \"(5) == (message.getSegmentsForOutput()[0].size())\", 5, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (5) == (message.getSegmentsForOutput()[0].size())",
               (int *)&local_1a0,(unsigned_long *)&reader);
  }
  OrphanGetImpl<unsigned_int,_(capnp::Kind)0>::truncateListOf(&orphan.builder,3);
  AVar3 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
  if (((AVar3.ptr)->size_ != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0 = 3;
    AVar3 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
    reader.reader.segment = (SegmentReader *)(AVar3.ptr)->size_;
    kj::_::Debug::log<char_const(&)[67],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4b5,ERROR,
               "\"failed: expected \" \"(3) == (message.getSegmentsForOutput()[0].size())\", 3, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (3) == (message.getSegmentsForOutput()[0].size())",
               (int *)&local_1a0,(unsigned_long *)&reader);
  }
  OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::applyReader
            (&reader,&orphan.builder);
  if ((reader.reader.elementCount != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0 = 3;
    local_19c = reader.reader.elementCount;
    kj::_::Debug::log<char_const(&)[40],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4b8,ERROR,"\"failed: expected \" \"(3) == (reader.size())\", 3, reader.size()",
               (char (*) [40])"failed: expected (3) == (reader.size())",(int *)&local_1a0,&local_19c
              );
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    uVar2 = (ulong)builder.builder.step * lVar1 >> 3;
    if (kj::_::Debug::minSeverity < 3 &&
        lVar1 + 0x75bcd15U != (ulong)*(uint *)(builder.builder.ptr + uVar2)) {
      local_1a0 = (int)lVar1 + 0x75bcd15;
      local_19c = *(ListElementCount *)(builder.builder.ptr + uVar2);
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4bb,ERROR,
                 "\"failed: expected \" \"(123456789 + i) == (builder[i])\", 123456789 + i, builder[i]"
                 ,(char (*) [49])"failed: expected (123456789 + i) == (builder[i])",&local_1a0,
                 &local_19c);
    }
    uVar2 = (ulong)reader.reader.step * lVar1 >> 3;
    if ((lVar1 + 0x75bcd15U != (ulong)*(uint *)(reader.reader.ptr + uVar2)) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_1a0 = (int)lVar1 + 0x75bcd15;
      local_19c = *(ListElementCount *)(reader.reader.ptr + uVar2);
      kj::_::Debug::log<char_const(&)[48],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4bc,ERROR,
                 "\"failed: expected \" \"(123456789 + i) == (reader[i])\", 123456789 + i, reader[i]"
                 ,(char (*) [48])"failed: expected (123456789 + i) == (reader[i])",&local_1a0,
                 &local_19c);
    }
  }
  for (lVar1 = 3; lVar1 != 7; lVar1 = lVar1 + 1) {
    uVar2 = (ulong)builder.builder.step * lVar1 >> 3;
    if ((*(int *)(builder.builder.ptr + uVar2) != 0) && (kj::_::Debug::minSeverity < 3)) {
      local_1a0 = 0;
      local_19c = *(ListElementCount *)(builder.builder.ptr + uVar2);
      kj::_::Debug::log<char_const(&)[37],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4bf,ERROR,"\"failed: expected \" \"(0) == (builder[i])\", 0, builder[i]",
                 (char (*) [37])"failed: expected (0) == (builder[i])",(int *)&local_1a0,&local_19c)
      ;
    }
  }
  builder.builder.ptr[0] = 'A';
  builder.builder.ptr[1] = '\x01';
  builder.builder.ptr[2] = '\0';
  builder.builder.ptr[3] = '\0';
  if ((*(ListElementCount *)reader.reader.ptr != 0x141) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0 = 0x141;
    local_19c = *(ListElementCount *)reader.reader.ptr;
    kj::_::Debug::log<char_const(&)[38],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4c5,ERROR,"\"failed: expected \" \"(321) == (reader[0])\", 321, reader[0]",
               (char (*) [38])"failed: expected (321) == (reader[0])",(int *)&local_1a0,&local_19c);
  }
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, TruncatePrimitiveList) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<List<uint32_t>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.set(i, 123456789 + i);
  }

  EXPECT_EQ(5, message.getSegmentsForOutput()[0].size());
  orphan.truncate(3);
  EXPECT_EQ(3, message.getSegmentsForOutput()[0].size());

  auto reader = orphan.getReader();
  EXPECT_EQ(3, reader.size());

  for (uint i = 0; i < 3; i++) {
    EXPECT_EQ(123456789 + i, builder[i]);
    EXPECT_EQ(123456789 + i, reader[i]);
  }
  for (uint i = 3; i < 7; i++) {
    EXPECT_EQ(0, builder[i]);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, 321);
  EXPECT_EQ(321, reader[0]);
}